

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1540.c
# Opt level: O1

size_t write_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = nmemb * size;
  iVar1 = *(int *)((long)userp + 0xc);
  *(int *)((long)userp + 0xc) = iVar1 + 1;
  if (iVar1 < 1) {
    curl_mprintf("Got %d bytes but pausing!\n",sVar2 & 0xffffffff);
    *(undefined4 *)((long)userp + 8) = 1;
    sVar2 = 0x10000001;
  }
  else {
    fwrite(ptr,size,nmemb,_stdout);
  }
  return sVar2;
}

Assistant:

static size_t write_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct transfer_status *st = (struct transfer_status *)userp;
  size_t len = size * nmemb;
  st->counter++;
  if(st->counter > 1) {
    /* the first call puts us on pause, so subsequent calls are after
       unpause */
    fwrite(ptr, size, nmemb, stdout);
    return len;
  }
  printf("Got %d bytes but pausing!\n", (int)len);
  st->halted = 1;
  return CURL_WRITEFUNC_PAUSE;
}